

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O2

void __thiscall Pl_XOR::~Pl_XOR(Pl_XOR *this)

{
  Pipeline::~Pipeline(&this->super_Pipeline);
  operator_delete(this,0x38);
  return;
}

Assistant:

~Pl_XOR() override = default;